

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ExtensionSet::SetAllocatedMessage
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor,
          MessageLite *message)

{
  byte bVar1;
  int iVar2;
  LogMessage *pLVar3;
  Extension *pEVar4;
  undefined4 extraout_var;
  Arena *pAVar6;
  Arena *pAVar7;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar8;
  LogMessage local_78;
  Arena *local_40;
  LogFinisher local_31;
  MessageLite *pMVar5;
  
  if (message == (MessageLite *)0x0) {
    pEVar4 = FindOrNull(this,number);
    if (pEVar4 == (Extension *)0x0) {
      return;
    }
    Extension::Clear(pEVar4);
    return;
  }
  local_40 = (Arena *)(message->_internal_metadata_).ptr_;
  if (((ulong)local_40 & 1) != 0) {
    local_40 = *(Arena **)((ulong)local_40 & 0xfffffffffffffffe);
  }
  pVar8 = Insert(this,number);
  pEVar4 = pVar8.first;
  pEVar4->descriptor = descriptor;
  if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar4->is_repeated != false) {
      LogMessage::LogMessage
                (&local_78,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/extension_set.cc"
                 ,0x285);
      pLVar3 = LogMessage::operator<<
                         (&local_78,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (OPTIONAL_FIELD): "
                         );
      LogFinisher::operator=(&local_31,pLVar3);
      LogMessage::~LogMessage(&local_78);
    }
    bVar1 = pEVar4->type;
    if ((byte)(bVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_78,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/extension_set.cc"
                 ,0x3c);
      pLVar3 = LogMessage::operator<<
                         (&local_78,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_31,pLVar3);
      LogMessage::~LogMessage(&local_78);
    }
    pAVar7 = local_40;
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) != 10) {
      LogMessage::LogMessage
                (&local_78,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/extension_set.cc"
                 ,0x285);
      pLVar3 = LogMessage::operator<<
                         (&local_78,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      pAVar7 = local_40;
      LogFinisher::operator=(&local_31,pLVar3);
      LogMessage::~LogMessage(&local_78);
    }
    if ((pEVar4->field_0xa & 0x10) != 0) {
      (*((pEVar4->field_0).message_value)->_vptr_MessageLite[5])
                ((pEVar4->field_0).message_value,message);
      goto LAB_001408dd;
    }
    pAVar6 = this->arena_;
    if (pAVar6 == (Arena *)0x0) {
      if ((pEVar4->field_0).message_value == (MessageLite *)0x0) {
        pAVar6 = (Arena *)0x0;
      }
      else {
        (*((pEVar4->field_0).message_value)->_vptr_MessageLite[1])();
        pAVar6 = this->arena_;
      }
    }
    if (pAVar7 == pAVar6) goto LAB_001408da;
  }
  else {
    pEVar4->type = type;
    pAVar7 = local_40;
    if ((byte)(type - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_78,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/extension_set.cc"
                 ,0x3c);
      pLVar3 = LogMessage::operator<<
                         (&local_78,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_31,pLVar3);
      pAVar7 = local_40;
      LogMessage::~LogMessage(&local_78);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4) != 10) {
      LogMessage::LogMessage
                (&local_78,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/extension_set.cc"
                 ,0x278);
      pLVar3 = LogMessage::operator<<
                         (&local_78,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_31,pLVar3);
      LogMessage::~LogMessage(&local_78);
    }
    pEVar4->is_repeated = false;
    pEVar4->field_0xa = pEVar4->field_0xa & 0xf;
    if (pAVar7 == this->arena_) {
LAB_001408da:
      (pEVar4->field_0).message_value = message;
      goto LAB_001408dd;
    }
  }
  if (pAVar7 == (Arena *)0x0) {
    (pEVar4->field_0).message_value = message;
    Arena::Own<google::protobuf::MessageLite>(this->arena_,message);
  }
  else {
    iVar2 = (*message->_vptr_MessageLite[4])(message);
    pMVar5 = (MessageLite *)CONCAT44(extraout_var,iVar2);
    (pEVar4->field_0).message_value = pMVar5;
    (*pMVar5->_vptr_MessageLite[8])(pMVar5,message);
  }
LAB_001408dd:
  pEVar4->field_0xa = pEVar4->field_0xa & 0xf0;
  return;
}

Assistant:

void ExtensionSet::SetAllocatedMessage(int number, FieldType type,
                                       const FieldDescriptor* descriptor,
                                       MessageLite* message) {
  if (message == NULL) {
    ClearExtension(number);
    return;
  }
  Arena* message_arena = message->GetArena();
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_lazy = false;
    if (message_arena == arena_) {
      extension->message_value = message;
    } else if (message_arena == NULL) {
      extension->message_value = message;
      arena_->Own(message);  // not NULL because not equal to message_arena
    } else {
      extension->message_value = message->New(arena_);
      extension->message_value->CheckTypeAndMergeFrom(*message);
    }
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    if (extension->is_lazy) {
      extension->lazymessage_value->SetAllocatedMessage(message);
    } else {
      if (arena_ == NULL) {
        delete extension->message_value;
      }
      if (message_arena == arena_) {
        extension->message_value = message;
      } else if (message_arena == NULL) {
        extension->message_value = message;
        arena_->Own(message);  // not NULL because not equal to message_arena
      } else {
        extension->message_value = message->New(arena_);
        extension->message_value->CheckTypeAndMergeFrom(*message);
      }
    }
  }
  extension->is_cleared = false;
}